

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wildmidi_lib.cpp
# Opt level: O0

void do_control_data_decrement(_mdi *mdi,_event_data *data)

{
  byte bVar1;
  uchar ch;
  _event_data *data_local;
  _mdi *mdi_local;
  
  bVar1 = data->channel;
  if (((mdi->channel[bVar1].reg_non == '\0') && (mdi->channel[bVar1].reg_data == 0)) &&
     (0 < mdi->channel[bVar1].pitch_range)) {
    mdi->channel[bVar1].pitch_range = mdi->channel[bVar1].pitch_range + -1;
  }
  return;
}

Assistant:

static void do_control_data_decrement(struct _mdi *mdi,
		struct _event_data *data) {
	unsigned char ch = data->channel;

	if ((mdi->channel[ch].reg_non == 0)
			&& (mdi->channel[ch].reg_data == 0x0000)) { /* Pitch Bend Range */
		if (mdi->channel[ch].pitch_range > 0)
			mdi->channel[ch].pitch_range--;
	}
}